

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

uint16_t lha_crc16(uint16_t crc,void *pp,size_t len)

{
  ushort *puVar1;
  ushort *puStack_30;
  anon_union_4_2_94730047 u;
  uint16_t *buff;
  uchar *p;
  size_t len_local;
  void *pp_local;
  uint16_t crc_local;
  
  pp_local._6_2_ = crc;
  if (len != 0) {
    buff = (uint16_t *)pp;
    p = (uchar *)len;
    pp_local._4_2_ = crc;
    if (((ulong)pp & 1) != 0) {
      buff = (uint16_t *)((long)pp + 1);
      pp_local._4_2_ = crc >> 8 ^ crc16tbl[0][(int)(((uint)crc ^ (uint)*pp) & 0xff)];
      p = (uchar *)(len - 1);
    }
    puStack_30 = buff;
    for (; puVar1 = puStack_30, (uchar *)0x7 < p; p = p + -8) {
      pp_local._4_2_ = pp_local._4_2_ ^ *puStack_30;
      puStack_30 = puStack_30 + 1;
      pp_local._4_2_ =
           crc16tbl[1][(int)(pp_local._4_2_ & 0xff)] ^ crc16tbl[0][(int)(uint)pp_local._4_2_ >> 8] ^
           *puStack_30;
      puStack_30 = puVar1 + 2;
      pp_local._4_2_ =
           crc16tbl[1][(int)(pp_local._4_2_ & 0xff)] ^ crc16tbl[0][(int)(uint)pp_local._4_2_ >> 8] ^
           *puStack_30;
      puStack_30 = puVar1 + 3;
      pp_local._4_2_ =
           crc16tbl[1][(int)(pp_local._4_2_ & 0xff)] ^ crc16tbl[0][(int)(uint)pp_local._4_2_ >> 8] ^
           *puStack_30;
      puStack_30 = puVar1 + 4;
      pp_local._4_2_ =
           crc16tbl[1][(int)(pp_local._4_2_ & 0xff)] ^ crc16tbl[0][(int)(uint)pp_local._4_2_ >> 8];
    }
    buff = puStack_30;
    for (; p != (uchar *)0x0; p = p + -1) {
      pp_local._4_2_ =
           pp_local._4_2_ >> 8 ^
           crc16tbl[0][(int)(((uint)pp_local._4_2_ ^ (uint)(byte)*buff) & 0xff)];
      buff = (uint16_t *)((long)buff + 1);
    }
    pp_local._6_2_ = pp_local._4_2_;
  }
  return pp_local._6_2_;
}

Assistant:

static uint16_t
lha_crc16(uint16_t crc, const void *pp, size_t len)
{
	const unsigned char *p = (const unsigned char *)pp;
	const uint16_t *buff;
	const union {
		uint32_t i;
		char c[4];
	} u = { 0x01020304 };

	if (len == 0)
		return crc;

	/* Process unaligned address. */
	if (((uintptr_t)p) & (uintptr_t)0x1) {
		crc = (crc >> 8) ^ crc16tbl[0][(crc ^ *p++) & 0xff];
		len--;
	}
	buff = (const uint16_t *)p;
	/*
	 * Modern C compiler such as GCC does not unroll automatically yet
	 * without unrolling pragma, and Clang is so. So we should
	 * unroll this loop for its performance.
	 */
	for (;len >= 8; len -= 8) {
		/* This if statement expects compiler optimization will
		 * remove the statement which will not be executed. */
#undef bswap16
#ifndef __has_builtin
#  define __has_builtin(x) 0
#endif
#if defined(_MSC_VER) && _MSC_VER >= 1400  /* Visual Studio */
#  define bswap16(x) _byteswap_ushort(x)
#elif defined(__GNUC__) && ((__GNUC__ == 4 && __GNUC_MINOR__ >= 8) || __GNUC__ > 4)
/* GCC 4.8 and later has __builtin_bswap16() */
#  define bswap16(x) __builtin_bswap16(x)
#elif defined(__clang__) && __has_builtin(__builtin_bswap16)
/* All clang versions have __builtin_bswap16() */
#  define bswap16(x) __builtin_bswap16(x)
#else
#  define bswap16(x) ((((x) >> 8) & 0xff) | ((x) << 8))
#endif
#define CRC16W	do { 	\
		if(u.c[0] == 1) { /* Big endian */		\
			crc ^= bswap16(*buff); buff++;		\
		} else						\
			crc ^= *buff++;				\
		crc = crc16tbl[1][crc & 0xff] ^ crc16tbl[0][crc >> 8];\
} while (0)
		CRC16W;
		CRC16W;
		CRC16W;
		CRC16W;
#undef CRC16W
#undef bswap16
	}

	p = (const unsigned char *)buff;
	for (;len; len--) {
		crc = (crc >> 8) ^ crc16tbl[0][(crc ^ *p++) & 0xff];
	}
	return crc;
}